

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_rope_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c,int n_dims,int mode,
              int n_ctx_orig,float freq_base,float freq_scale,float ext_factor,float attn_factor,
              float beta_fast,float beta_slow,_Bool inplace)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  char *file;
  
  if ((mode & 1U) == 0) {
    if (((b->ne[1] == 1) && (b->ne[2] == 1)) && (b->ne[3] == 1)) {
      if (b->type == GGML_TYPE_I32) {
        if (a->ne[2] == b->ne[0]) {
          if (c != (ggml_tensor *)0x0) {
            if (c->type != GGML_TYPE_F32) {
              file = 
              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
              ;
              pcVar2 = "c->type == GGML_TYPE_F32";
              line = 0xded;
              goto LAB_0011caf9;
            }
            if (c->ne[0] < (long)(n_dims / 2)) {
              file = 
              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
              ;
              pcVar2 = "c->ne[0] >= n_dims / 2";
              line = 0xdee;
              goto LAB_0011caf9;
            }
          }
          if (inplace) {
            pgVar1 = ggml_view_tensor(ctx,a);
          }
          else {
            pgVar1 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
          }
          if (pgVar1 != (ggml_tensor *)0x0) {
            pgVar1->op_params[1] = n_dims;
            pgVar1->op_params[2] = mode;
            pgVar1->op_params[3] = 0;
            pgVar1->op_params[4] = n_ctx_orig;
            pgVar1->op_params[5] = (int32_t)freq_base;
            pgVar1->op_params[6] = (int32_t)freq_scale;
            pgVar1->op_params[7] = (int32_t)ext_factor;
            pgVar1->op_params[8] = (int32_t)attn_factor;
            pgVar1->op_params[9] = (int32_t)beta_fast;
            pgVar1->op_params[10] = (int32_t)beta_slow;
            pgVar1->op_params[0xb] = 0;
            pgVar1->op_params[0xc] = 0;
            pgVar1->op_params[0xd] = 0;
            pgVar1->op_params[0xe] = 0;
            pgVar1->op = GGML_OP_ROPE;
            pgVar1->op_params[0] = 0;
            pgVar1->src[0] = a;
            pgVar1->src[1] = b;
            pgVar1->src[2] = c;
            return pgVar1;
          }
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-impl.h"
          ;
          pcVar2 = "tensor != NULL";
          line = 0x70;
        }
        else {
          file = 
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c";
          pcVar2 = "a->ne[2] == b->ne[0]";
          line = 0xdea;
        }
      }
      else {
        file = 
        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c";
        pcVar2 = "b->type == GGML_TYPE_I32";
        line = 0xde9;
      }
    }
    else {
      file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
      ;
      pcVar2 = "ggml_is_vector(b)";
      line = 0xde8;
    }
  }
  else {
    file = "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c";
    pcVar2 = "(mode & 1) == 0 && \"mode & 1 == 1 is no longer supported\"";
    line = 0xde6;
  }
LAB_0011caf9:
  ggml_abort(file,line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

static struct ggml_tensor * ggml_rope_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        struct ggml_tensor  * c,
        int                   n_dims,
        int                   mode,
        int                   n_ctx_orig,
        float                 freq_base,
        float                 freq_scale,
        float                 ext_factor,
        float                 attn_factor,
        float                 beta_fast,
        float                 beta_slow,
        bool                  inplace) {
    GGML_ASSERT((mode & 1) == 0 && "mode & 1 == 1 is no longer supported");

    GGML_ASSERT(ggml_is_vector(b));
    GGML_ASSERT(b->type == GGML_TYPE_I32);
    GGML_ASSERT(a->ne[2] == b->ne[0]);

    if (c) {
        GGML_ASSERT(c->type == GGML_TYPE_F32);
        GGML_ASSERT(c->ne[0] >= n_dims / 2);
    }

    int sections[4] = {0, 0, 0, 0};

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    int32_t params[15] = { /*n_past*/ 0, n_dims, mode, /*n_ctx*/ 0, n_ctx_orig };
    memcpy(params +  5, &freq_base,    sizeof(float));
    memcpy(params +  6, &freq_scale,   sizeof(float));
    memcpy(params +  7, &ext_factor,   sizeof(float));
    memcpy(params +  8, &attn_factor,  sizeof(float));
    memcpy(params +  9, &beta_fast,    sizeof(float));
    memcpy(params + 10, &beta_slow,    sizeof(float));
    memcpy(params + 11, &sections,     sizeof(int)*4);
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_ROPE;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}